

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall pbrt::Image::Image(Image *this,Image *param_1)

{
  int iVar1;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (param_1->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar1 = (param_1->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  this->format = param_1->format;
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar1;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&this->channelNames,&param_1->channelNames,&local_38);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (param_1->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            (&this->p8,&param_1->p8,(polymorphic_allocator<unsigned_char> *)&local_38);
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
            (&this->p16,&param_1->p16,(polymorphic_allocator<pbrt::Half> *)&local_38);
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->p32,&param_1->p32,(polymorphic_allocator<float> *)&local_38);
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}